

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrShaderProgram.cpp
# Opt level: O2

void __thiscall
sglr::ShaderProgram::ShaderProgram(ShaderProgram *this,ShaderProgramDeclaration *decl)

{
  vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_> *this_00;
  GenericVecType GVar1;
  pointer pVVar2;
  pointer pVVar3;
  pointer pVVar4;
  pointer pVVar5;
  pointer pGVar6;
  pointer pFVar7;
  pointer pFVar8;
  pointer pFVar9;
  size_t numVaryingInputs;
  vector<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
  *pvVar10;
  size_t ndx_1;
  vector<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
  *pvVar11;
  pointer *ppVVar12;
  size_t numVaryingOutputs;
  pointer pUVar13;
  size_t ndx;
  pointer *ppVVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  allocator<char> local_63;
  allocator_type local_62;
  allocator_type local_61;
  string *local_60;
  string *local_58;
  string *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  FragmentShader *local_40;
  GeometryShader *local_38;
  
  ppVVar14 = &(decl->m_vertexToFragmentVaryings).
              super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  bVar18 = decl->m_geometryShaderSet == false;
  pvVar11 = (vector<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
             *)&decl->m_vertexToGeometryVaryings;
  if (bVar18) {
    pvVar11 = &decl->m_vertexToFragmentVaryings;
  }
  ppVVar12 = &(decl->m_vertexToGeometryVaryings).
              super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar18) {
    ppVVar12 = (pointer *)ppVVar14;
  }
  rr::VertexShader::VertexShader
            (&this->super_VertexShader,
             ((long)(decl->m_vertexAttributes).
                    super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(decl->m_vertexAttributes).
                   super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x28,
             (long)*ppVVar12 -
             (long)(pvVar11->
                   super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3);
  local_38 = &this->super_GeometryShader;
  numVaryingOutputs =
       (long)(decl->m_geometryToFragmentVaryings).
             super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(decl->m_geometryToFragmentVaryings).
             super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  numVaryingInputs =
       (long)(decl->m_vertexToGeometryVaryings).
             super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(decl->m_vertexToGeometryVaryings).
             super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  if (decl->m_geometryShaderSet == false) {
    numVaryingOutputs = 0;
    numVaryingInputs = 0;
  }
  rr::GeometryShader::GeometryShader
            (local_38,numVaryingInputs,numVaryingOutputs,(decl->m_geometryDecl).inputType,
             (decl->m_geometryDecl).outputType,(decl->m_geometryDecl).numOutputVertices,
             (decl->m_geometryDecl).numInvocations);
  local_40 = &this->super_FragmentShader;
  pvVar10 = (vector<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
             *)&decl->m_vertexToFragmentVaryings;
  if (decl->m_geometryShaderSet != false) {
    ppVVar14 = (pointer *)
               &(decl->m_geometryToFragmentVaryings).
                super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    pvVar10 = &decl->m_geometryToFragmentVaryings;
  }
  rr::FragmentShader::FragmentShader
            (local_40,(long)*ppVVar14 -
                      (long)(((_Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
                               *)&pvVar10->
                                  super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
                             )->_M_impl).super__Vector_impl_data._M_start >> 3,
             (long)(decl->m_fragmentOutputs).
                   super__Vector_base<sglr::pdec::FragmentOutput,_std::allocator<sglr::pdec::FragmentOutput>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(decl->m_fragmentOutputs).
                   super__Vector_base<sglr::pdec::FragmentOutput,_std::allocator<sglr::pdec::FragmentOutput>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2);
  (this->super_VertexShader)._vptr_VertexShader = (_func_int **)&PTR___cxa_pure_virtual_01e70f20;
  (this->super_GeometryShader)._vptr_GeometryShader = (_func_int **)&DAT_01e70f58;
  (this->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&DAT_01e70f70;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_attributeNames,
           ((long)(decl->m_vertexAttributes).
                  super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(decl->m_vertexAttributes).
                 super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x28,&local_61);
  this_00 = &this->m_uniforms;
  local_48 = &this->m_attributeNames;
  std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::vector
            (this_00,((long)(decl->m_uniforms).
                            super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(decl->m_uniforms).
                           super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x28,&local_62);
  std::__cxx11::string::string((string *)&this->m_vertSrc,(string *)&decl->m_vertexSource);
  local_58 = &this->m_fragSrc;
  local_50 = &this->m_vertSrc;
  std::__cxx11::string::string((string *)local_58,(string *)&decl->m_fragmentSource);
  local_60 = &this->m_geomSrc;
  if (decl->m_geometryShaderSet == true) {
    std::__cxx11::string::string((string *)local_60,(string *)&decl->m_geometrySource);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,glcts::fixed_sample_locations_values + 1,&local_63);
  }
  this->m_hasGeometryShader = decl->m_geometryShaderSet;
  lVar17 = 0;
  lVar16 = 0;
  for (uVar15 = 0;
      pVVar2 = (decl->m_vertexAttributes).
               super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar15 < (ulong)(((long)(decl->m_vertexAttributes).
                              super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x28);
      uVar15 = uVar15 + 1) {
    (this->super_VertexShader).m_inputs.
    super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
    super__Vector_impl_data._M_start[uVar15].type =
         *(GenericVecType *)((long)&pVVar2->type + lVar17);
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)&(((this->m_attributeNames).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar16));
    lVar16 = lVar16 + 0x20;
    lVar17 = lVar17 + 0x28;
  }
  if (this->m_hasGeometryShader == false) {
    for (uVar15 = 0;
        pVVar5 = (decl->m_vertexToFragmentVaryings).
                 super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar15 < (ulong)((long)(decl->m_vertexToFragmentVaryings).
                               super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 3);
        uVar15 = uVar15 + 1) {
      GVar1 = pVVar5[uVar15].type;
      pVVar4 = (this->super_VertexShader).m_outputs.
               super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar4[uVar15].type = GVar1;
      bVar18 = pVVar5[uVar15].flatshade;
      pVVar4[uVar15].flatshade = bVar18;
      pVVar4 = (this->super_FragmentShader).m_inputs.
               super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar4[uVar15].flatshade = bVar18;
      pVVar4[uVar15].type = GVar1;
    }
  }
  else {
    for (uVar15 = 0;
        pVVar3 = (decl->m_vertexToGeometryVaryings).
                 super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar15 < (ulong)((long)(decl->m_vertexToGeometryVaryings).
                               super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3 >> 3);
        uVar15 = uVar15 + 1) {
      GVar1 = pVVar3[uVar15].type;
      pVVar4 = (this->super_VertexShader).m_outputs.
               super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar4[uVar15].type = GVar1;
      bVar18 = pVVar3[uVar15].flatshade;
      pVVar4[uVar15].flatshade = bVar18;
      pVVar4 = (this->super_GeometryShader).m_inputs.
               super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar4[uVar15].flatshade = bVar18;
      pVVar4[uVar15].type = GVar1;
    }
    for (uVar15 = 0;
        pGVar6 = (decl->m_geometryToFragmentVaryings).
                 super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar15 < (ulong)((long)(decl->m_geometryToFragmentVaryings).
                               super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar6 >> 3);
        uVar15 = uVar15 + 1) {
      GVar1 = pGVar6[uVar15].type;
      pVVar4 = (this->super_GeometryShader).m_outputs.
               super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar4[uVar15].type = GVar1;
      bVar18 = pGVar6[uVar15].flatshade;
      pVVar4[uVar15].flatshade = bVar18;
      pVVar4 = (this->super_FragmentShader).m_inputs.
               super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar4[uVar15].flatshade = bVar18;
      pVVar4[uVar15].type = GVar1;
    }
  }
  pFVar7 = (decl->m_fragmentOutputs).
           super__Vector_base<sglr::pdec::FragmentOutput,_std::allocator<sglr::pdec::FragmentOutput>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar8 = (decl->m_fragmentOutputs).
           super__Vector_base<sglr::pdec::FragmentOutput,_std::allocator<sglr::pdec::FragmentOutput>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar9 = (this->super_FragmentShader).m_outputs.
           super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (lVar16 = 0; (long)pFVar8 - (long)pFVar7 >> 2 != lVar16; lVar16 = lVar16 + 1) {
    pFVar9[lVar16].type = pFVar7[lVar16].type;
  }
  pUVar13 = (decl->m_uniforms).
            super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar17 = 0;
  lVar16 = 0;
  for (uVar15 = 0;
      uVar15 < (ulong)(((long)(decl->m_uniforms).
                              super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar13) / 0x28);
      uVar15 = uVar15 + 1) {
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)&(((this_00->
                         super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>).
                         _M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + lVar16)
              );
    pUVar13 = (decl->m_uniforms).
              super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>._M_impl.
              super__Vector_impl_data._M_start;
    *(undefined4 *)
     ((long)&((this_00->super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>).
              _M_impl.super__Vector_impl_data._M_start)->type + lVar16) =
         *(undefined4 *)((long)&pUVar13->type + lVar17);
    lVar16 = lVar16 + 0x70;
    lVar17 = lVar17 + 0x28;
  }
  return;
}

Assistant:

ShaderProgram::ShaderProgram (const pdec::ShaderProgramDeclaration& decl)
	: rr::VertexShader		(decl.getVertexInputCount(), decl.getVertexOutputCount())
	, rr::GeometryShader	(decl.getGeometryInputCount(),
							 decl.getGeometryOutputCount(),
							 decl.m_geometryDecl.inputType,
							 decl.m_geometryDecl.outputType,
							 decl.m_geometryDecl.numOutputVertices,
							 decl.m_geometryDecl.numInvocations)
	, rr::FragmentShader	(decl.getFragmentInputCount(), decl.getFragmentOutputCount())
	, m_attributeNames		(decl.getVertexInputCount())
	, m_uniforms			(decl.m_uniforms.size())
	, m_vertSrc				(decl.m_vertexSource)
	, m_fragSrc				(decl.m_fragmentSource)
	, m_geomSrc				(decl.hasGeometryShader() ? (decl.m_geometrySource) : (""))
	, m_hasGeometryShader	(decl.hasGeometryShader())
{
	DE_ASSERT(decl.valid());

	// Set up shader IO

	for (size_t ndx = 0; ndx < decl.m_vertexAttributes.size(); ++ndx)
	{
		this->rr::VertexShader::m_inputs[ndx].type	= decl.m_vertexAttributes[ndx].type;
		m_attributeNames[ndx]						= decl.m_vertexAttributes[ndx].name;
	}

	if (m_hasGeometryShader)
	{
		for (size_t ndx = 0; ndx < decl.m_vertexToGeometryVaryings.size(); ++ndx)
		{
			this->rr::VertexShader::m_outputs[ndx].type			= decl.m_vertexToGeometryVaryings[ndx].type;
			this->rr::VertexShader::m_outputs[ndx].flatshade	= decl.m_vertexToGeometryVaryings[ndx].flatshade;

			this->rr::GeometryShader::m_inputs[ndx]				= this->rr::VertexShader::m_outputs[ndx];
		}
		for (size_t ndx = 0; ndx < decl.m_geometryToFragmentVaryings.size(); ++ndx)
		{
			this->rr::GeometryShader::m_outputs[ndx].type		= decl.m_geometryToFragmentVaryings[ndx].type;
			this->rr::GeometryShader::m_outputs[ndx].flatshade	= decl.m_geometryToFragmentVaryings[ndx].flatshade;

			this->rr::FragmentShader::m_inputs[ndx]				= this->rr::GeometryShader::m_outputs[ndx];
		}
	}
	else
	{
		for (size_t ndx = 0; ndx < decl.m_vertexToFragmentVaryings.size(); ++ndx)
		{
			this->rr::VertexShader::m_outputs[ndx].type			= decl.m_vertexToFragmentVaryings[ndx].type;
			this->rr::VertexShader::m_outputs[ndx].flatshade	= decl.m_vertexToFragmentVaryings[ndx].flatshade;

			this->rr::FragmentShader::m_inputs[ndx]				= this->rr::VertexShader::m_outputs[ndx];
		}
	}

	for (size_t ndx = 0; ndx < decl.m_fragmentOutputs.size(); ++ndx)
		this->rr::FragmentShader::m_outputs[ndx].type = decl.m_fragmentOutputs[ndx].type;

	// Set up uniforms

	for (size_t ndx = 0; ndx < decl.m_uniforms.size(); ++ndx)
	{
		this->m_uniforms[ndx].name = decl.m_uniforms[ndx].name;
		this->m_uniforms[ndx].type = decl.m_uniforms[ndx].type;
	}
}